

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t read_bits_16(archive_read *a,rar5 *rar,uint8_t *p,uint16_t *value)

{
  long lVar1;
  
  lVar1 = (long)(rar->bits).in_addr;
  if (lVar1 < (rar->cstate).cur_block_size) {
    *value = (uint16_t)
             (((uint)p[lVar1 + 2] | (uint)p[lVar1 + 1] << 8 | (uint)p[lVar1] << 0x10) >>
             (8U - (rar->bits).bit_addr & 0x1f));
    return L'\0';
  }
  archive_set_error(&a->archive,0x16,"Premature end of stream during extraction of data (#2)");
  return L'\xffffffe2';
}

Assistant:

static int read_bits_16(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint16_t* value)
{
	if(rar->bits.in_addr >= rar->cstate.cur_block_size) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_PROGRAMMER,
			"Premature end of stream during extraction of data (#2)");
		return ARCHIVE_FATAL;
	}

	int bits = (int) ((uint32_t) p[rar->bits.in_addr]) << 16;
	bits |= (int) p[rar->bits.in_addr + 1] << 8;
	bits |= (int) p[rar->bits.in_addr + 2];
	bits >>= (8 - rar->bits.bit_addr);
	*value = bits & 0xffff;
	return ARCHIVE_OK;
}